

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conspage.c
# Opt level: O0

ConsCell * find_pair_in_page(conspage *pg,LispPTR cdrval)

{
  uint uVar1;
  ConsCell *pCVar2;
  LispPTR *pLVar3;
  uint *puVar4;
  uint local_48;
  uint local_44;
  uint poffset;
  uint nprior;
  uint noffset;
  uint priorprior;
  uint prior;
  uint offset;
  ConsCell *cdrcell;
  ConsCell *carcell;
  LispPTR cdrval_local;
  conspage *pg_local;
  
  if (1 < *(uint *)&pg->field_0x8 >> 0x18) {
    local_44 = 0;
    noffset = 0;
    nprior = 0;
    for (priorprior = *(uint *)&pg->field_0x8 >> 0x10 & 0xff; priorprior != 0;
        priorprior = *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2) >> 0x18) {
      if (noffset != 0) {
        if ((priorprior < noffset) && (noffset <= priorprior + 0xe)) {
          local_48 = priorprior;
          uVar1 = *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2);
          while (poffset = uVar1 >> 0x18, priorprior < poffset && poffset < noffset) {
            local_44 = priorprior;
            local_48 = noffset;
            uVar1 = *(uint *)((long)&pg->cell6 + (ulong)poffset * 2);
            priorprior = poffset;
          }
          pCVar2 = (ConsCell *)((long)&pg->cell6 + (ulong)priorprior * 2);
          pLVar3 = (LispPTR *)((long)&pg->cell6 + (ulong)noffset * 2);
          if (nprior == 0) {
            *(uint *)&pg->field_0x8 =
                 *(uint *)&pg->field_0x8 & 0xff00ffff |
                 (*(uint *)((long)&pg->cell6 + (ulong)local_48 * 2) >> 0x18) << 0x10;
          }
          else {
            *(uint *)((long)&pg->cell6 + (ulong)nprior * 2) =
                 *(uint *)((long)&pg->cell6 + (ulong)nprior * 2) & 0xffffff |
                 *(uint *)((long)&pg->cell6 + (ulong)local_48 * 2) & 0xff000000;
          }
          if (local_44 != 0) {
            *(uint *)((long)&pg->cell6 + (ulong)local_44 * 2) =
                 *(uint *)((long)&pg->cell6 + (ulong)local_44 * 2) & 0xffffff |
                 *(uint *)((long)&pg->cell6 + (ulong)priorprior * 2) & 0xff000000;
          }
          *(uint *)&pCVar2->field_0x0 =
               *(uint *)&pCVar2->field_0x0 & 0xfffffff |
               (int)((long)pLVar3 - (long)pCVar2 >> 2) << 0x1c;
          if (7 < (long)pLVar3 - (long)pCVar2 >> 2) {
            error("in find_pair_in_page, cdr code too big.");
          }
          if (0xfe < priorprior + (*(uint *)&pCVar2->field_0x0 >> 0x1c) * 2) {
            error("in fpip, page overflow.");
          }
          *(uint *)&pg->field_0x8 =
               *(uint *)&pg->field_0x8 & 0xffffff |
               ((*(uint *)&pg->field_0x8 >> 0x18) - 2) * 0x1000000;
          *pLVar3 = cdrval;
          return pCVar2;
        }
        if ((noffset < priorprior) && (priorprior <= noffset + 0xe)) {
          pCVar2 = (ConsCell *)((long)&pg->cell6 + (ulong)noffset * 2);
          puVar4 = (uint *)((long)&pg->cell6 + (ulong)priorprior * 2);
          if (nprior == 0) {
            *(uint *)&pg->field_0x8 =
                 *(uint *)&pg->field_0x8 & 0xff00ffff | (*puVar4 >> 0x18) << 0x10;
          }
          else {
            *(uint *)((long)&pg->cell6 + (ulong)nprior * 2) =
                 *(uint *)((long)&pg->cell6 + (ulong)nprior * 2) & 0xffffff | *puVar4 & 0xff000000;
          }
          *(uint *)&pCVar2->field_0x0 =
               *(uint *)&pCVar2->field_0x0 & 0xfffffff |
               (int)((long)puVar4 - (long)pCVar2 >> 2) << 0x1c;
          if (7 < (long)puVar4 - (long)pCVar2 >> 2) {
            error("in find_pair_in_page, cdr code too big.");
          }
          if (0xfe < noffset + (*(uint *)&pCVar2->field_0x0 >> 0x1c) * 2) {
            error("in fpip, page overflow.");
          }
          *(uint *)&pg->field_0x8 =
               *(uint *)&pg->field_0x8 & 0xffffff |
               ((*(uint *)&pg->field_0x8 >> 0x18) - 2) * 0x1000000;
          *puVar4 = cdrval;
          return pCVar2;
        }
      }
      nprior = noffset;
      noffset = priorprior;
    }
  }
  return (ConsCell *)0x0;
}

Assistant:

static ConsCell *find_pair_in_page(struct conspage *pg, LispPTR cdrval) {
  ConsCell *carcell, *cdrcell;
  unsigned int offset, prior, priorprior, noffset, nprior, poffset;

  if (pg->count < 2) return ((ConsCell *)0);

  priorprior = prior = nprior = 0;

  for (offset = pg->next_cell; offset; offset = FREECONS(pg, offset)->next_free) {
    if (prior) {
      /* if ((6^prior) <= (6^offset)) error("free list in CONS page corrupt."); */
      if ((prior > offset) && (prior <= offset + 14)) {
        poffset = offset;
        noffset = FREECONS(pg, offset)->next_free;
        while ((noffset > offset) && (noffset < prior)) {
          nprior = offset;
          poffset = prior;
          offset = noffset;
          noffset = FREECONS(pg, offset)->next_free;
        }
        carcell = (ConsCell *)((DLword *)pg + offset);
        cdrcell = (ConsCell *)((DLword *)pg + prior);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
        else
          pg->next_cell = FREECONS(pg, poffset)->next_free;
        if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (offset + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      } else if ((offset > prior) && (offset <= prior + 14)) {
        carcell = (ConsCell *)((DLword *)pg + prior);
        cdrcell = (ConsCell *)((DLword *)pg + offset);
        if (priorprior)
          FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
        else
          pg->next_cell = ((freecons *)cdrcell)->next_free;
        carcell->cdr_code = cdrcell - carcell;
#ifdef NEWCDRCODING
        if ((cdrcell - carcell) > 7) error("in find_pair_in_page, cdr code too big.");
        if (254 < (prior + (carcell->cdr_code << 1))) error("in fpip, page overflow.");
#endif /* NEWCDRCODING */
        pg->count -= 2;
        *((LispPTR *)cdrcell) = cdrval;
        return (carcell);
      }
    }
    priorprior = prior;
    prior = offset;
  }
  return ((ConsCell *)0);
}